

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

void cmSystemTools::Error(string *m)

{
  undefined1 local_30 [8];
  string message;
  string *m_local;
  
  message.field_2._8_8_ = m;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
                 "CMake Error: ",m);
  s_ErrorOccured = true;
  Message((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,"Error");
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void cmSystemTools::Error(const std::string& m)
{
  std::string message = "CMake Error: " + m;
  cmSystemTools::s_ErrorOccured = true;
  cmSystemTools::Message(message, "Error");
}